

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O1

int value_for_key_as_string(MMDB_entry_s *start,char *key,char **value)

{
  int iVar1;
  char *pcVar2;
  MMDB_entry_data_s entry_data;
  char *path [2];
  MMDB_entry_data_s MStack_48;
  char *local_18;
  undefined8 local_10;
  
  local_18 = "database_type";
  local_10 = 0;
  iVar1 = MMDB_aget_value(start,&MStack_48,&local_18);
  if ((iVar1 == 0) && (iVar1 = 3, MStack_48.type == 2)) {
    pcVar2 = mmdb_strndup(MStack_48.field_1.utf8_string,(ulong)MStack_48.data_size);
    *(char **)key = pcVar2;
    iVar1 = (uint)(pcVar2 == (char *)0x0) * 5;
  }
  return iVar1;
}

Assistant:

static int
value_for_key_as_string(MMDB_entry_s *start, char *key, char const **value) {
    MMDB_entry_data_s entry_data;
    const char *path[] = {key, NULL};
    int status = MMDB_aget_value(start, &entry_data, path);
    if (MMDB_SUCCESS != status) {
        return status;
    }
    if (MMDB_DATA_TYPE_UTF8_STRING != entry_data.type) {
        DEBUG_MSGF("expect string for %s but received %s",
                   key,
                   type_num_to_name(entry_data.type));
        return MMDB_INVALID_METADATA_ERROR;
    }
    *value = mmdb_strndup(entry_data.utf8_string, entry_data.data_size);
    if (NULL == *value) {
        return MMDB_OUT_OF_MEMORY_ERROR;
    }
    return MMDB_SUCCESS;
}